

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parg.hh
# Opt level: O0

int __thiscall
OB::Parg::parse_args
          (Parg *this,int _argc,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *_argv)

{
  undefined8 uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  bool bVar3;
  long lVar4;
  ulong uVar5;
  char *pcVar6;
  undefined1 *puVar7;
  reference pvVar8;
  mapped_type *pmVar9;
  mapped_type *pmVar10;
  byte local_551;
  byte local_431;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_400;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  _Self local_2e0;
  _Self local_2d8;
  string local_2d0 [32];
  string local_2b0 [32];
  long local_290;
  size_type delim;
  string a;
  string c_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  _Self local_1c8;
  _Self local_1c0;
  allocator<char> local_1b2;
  undefined1 local_1b1;
  undefined1 *local_1b0;
  undefined8 local_1a8;
  undefined1 local_1a0 [8];
  string s;
  size_t j;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  string local_138 [32];
  string local_118 [36];
  int local_f4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  _Self local_b0;
  _Self local_a8;
  allocator<char> local_9a;
  undefined1 local_99;
  undefined1 *local_98;
  undefined8 local_90;
  undefined1 local_88 [8];
  string c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  string *tmp;
  int i;
  bool dashdash;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *_argv_local;
  Parg *pPStack_18;
  int _argc_local;
  Parg *this_local;
  
  if (_argc < 1) {
    this_local._4_4_ = 1;
  }
  else {
    tmp._7_1_ = 0;
    _i = _argv;
    _argv_local._4_4_ = _argc;
    pPStack_18 = this;
    for (tmp._0_4_ = 0; (int)tmp < _argv_local._4_4_; tmp._0_4_ = (int)tmp + 1) {
      local_38 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::at(_argv,(long)(int)tmp);
      if ((tmp._7_1_ & 1) == 0) {
        uVar5 = std::__cxx11::string::size();
        if (((uVar5 < 2) ||
            (pcVar6 = (char *)std::__cxx11::string::at((ulong)local_38), *pcVar6 != '-')) ||
           (pcVar6 = (char *)std::__cxx11::string::at((ulong)local_38), *pcVar6 == '-')) {
          uVar5 = std::__cxx11::string::size();
          if (((uVar5 < 3) ||
              (pcVar6 = (char *)std::__cxx11::string::at((ulong)local_38), *pcVar6 != '-')) ||
             (pcVar6 = (char *)std::__cxx11::string::at((ulong)local_38), pbVar2 = local_38,
             *pcVar6 != '-')) {
            lVar4 = std::__cxx11::string::size();
            if ((lVar4 == 0) || ((this->is_positional_ & 1U) == 0)) {
              std::operator+(&local_400,"no match for \'",local_38);
              std::operator+(&local_3e0,&local_400,"\'");
              std::__cxx11::string::operator=((string *)&this->error_,(string *)&local_3e0);
              std::__cxx11::string::~string((string *)&local_3e0);
              std::__cxx11::string::~string((string *)&local_400);
              return -1;
            }
            bVar3 = std::operator==(local_38,"--");
            if (bVar3) {
              tmp._7_1_ = 1;
            }
            else {
              lVar4 = std::__cxx11::string::size();
              if (lVar4 == 0) {
                std::__cxx11::string::append((string *)&this->positional_);
              }
              else {
                std::operator+(&local_3c0," ",local_38);
                std::__cxx11::string::append((string *)&this->positional_);
                std::__cxx11::string::~string((string *)&local_3c0);
              }
            }
            goto LAB_00110601;
          }
          std::__cxx11::string::size();
          std::__cxx11::string::substr((ulong)((long)&a.field_2 + 8),(ulong)pbVar2);
          std::__cxx11::string::string((string *)&delim);
          local_290 = std::__cxx11::string::find(a.field_2._M_local_buf + 8,0x15e31d);
          if (local_290 != -1) {
            std::__cxx11::string::substr((ulong)local_2b0,(ulong)local_38);
            std::__cxx11::string::operator=((string *)(a.field_2._M_local_buf + 8),local_2b0);
            std::__cxx11::string::~string(local_2b0);
            pbVar2 = local_38;
            std::__cxx11::string::size();
            std::__cxx11::string::substr((ulong)local_2d0,(ulong)pbVar2);
            std::__cxx11::string::operator=((string *)&delim,local_2d0);
            std::__cxx11::string::~string(local_2d0);
          }
          local_2d8._M_node =
               (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
               ::find(&this->data_,(key_type *)((long)&a.field_2 + 8));
          local_2e0._M_node =
               (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
               ::end(&this->data_);
          bVar3 = std::operator!=(&local_2d8,&local_2e0);
          if (bVar3) {
            pmVar10 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                      ::at(&this->data_,(key_type *)((long)&a.field_2 + 8));
            if ((pmVar10->seen_ & 1U) == 0) {
              pmVar10 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                        ::at(&this->data_,(key_type *)((long)&a.field_2 + 8));
              if (((pmVar10->mode_ & 1U) == 0) || (lVar4 = std::__cxx11::string::size(), lVar4 != 0)
                 ) {
                lVar4 = std::__cxx11::string::size();
                if (lVar4 == 0) {
                  if (_argv_local._4_4_ <= (int)tmp + 1) {
                    std::operator+(&local_360,"option \'--",
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)((long)&a.field_2 + 8));
                    std::operator+(&local_340,&local_360,"\' requires an arg");
                    std::__cxx11::string::operator=((string *)&this->error_,(string *)&local_340);
                    std::__cxx11::string::~string((string *)&local_340);
                    std::__cxx11::string::~string((string *)&local_360);
                    this_local._4_4_ = -1;
                    local_f4 = 1;
                    goto LAB_00110430;
                  }
                  pvVar8 = std::
                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::at(_argv,(long)((int)tmp + 1));
                  pmVar10 = std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                            ::at(&this->data_,(key_type *)((long)&a.field_2 + 8));
                  std::__cxx11::string::operator=((string *)&pmVar10->value_,(string *)pvVar8);
                  pmVar10 = std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                            ::at(&this->data_,(key_type *)((long)&a.field_2 + 8));
                  pmVar10->seen_ = true;
                  tmp._0_4_ = (int)tmp + 1;
                }
                else {
                  pmVar10 = std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                            ::at(&this->data_,(key_type *)((long)&a.field_2 + 8));
                  std::__cxx11::string::operator=((string *)&pmVar10->value_,(string *)&delim);
                  pmVar10 = std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                            ::at(&this->data_,(key_type *)((long)&a.field_2 + 8));
                  pmVar10->seen_ = true;
                }
              }
              else {
                pmVar10 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                          ::at(&this->data_,(key_type *)((long)&a.field_2 + 8));
                std::__cxx11::string::operator=((string *)&pmVar10->value_,"1");
                pmVar10 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                          ::at(&this->data_,(key_type *)((long)&a.field_2 + 8));
                pmVar10->seen_ = true;
              }
              local_f4 = 0;
            }
            else {
              std::operator+(&local_320,"option \'--",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)&a.field_2 + 8));
              std::operator+(&local_300,&local_320,"\' has already been seen");
              std::__cxx11::string::operator=((string *)&this->error_,(string *)&local_300);
              std::__cxx11::string::~string((string *)&local_300);
              std::__cxx11::string::~string((string *)&local_320);
              this_local._4_4_ = -1;
              local_f4 = 1;
            }
          }
          else {
            std::operator+(&local_3a0,"invalid option \'",local_38);
            std::operator+(&local_380,&local_3a0,"\'");
            std::__cxx11::string::operator=((string *)&this->error_,(string *)&local_380);
            std::__cxx11::string::~string((string *)&local_380);
            std::__cxx11::string::~string((string *)&local_3a0);
            this_local._4_4_ = -1;
            local_f4 = 1;
          }
LAB_00110430:
          std::__cxx11::string::~string((string *)&delim);
          std::__cxx11::string::~string((string *)(a.field_2._M_local_buf + 8));
        }
        else {
          puVar7 = (undefined1 *)std::__cxx11::string::at((ulong)local_38);
          local_99 = *puVar7;
          local_98 = &local_99;
          local_90 = 1;
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)local_88,local_98,local_90,&local_9a);
          std::allocator<char>::~allocator(&local_9a);
          local_a8._M_node =
               (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::find(&this->flags_,(key_type *)local_88);
          local_b0._M_node =
               (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::end(&this->flags_);
          bVar3 = std::operator!=(&local_a8,&local_b0);
          local_431 = 0;
          if (bVar3) {
            pmVar9 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::at(&this->flags_,(key_type *)local_88);
            pmVar10 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                      ::at(&this->data_,pmVar9);
            local_431 = pmVar10->mode_ ^ 0xff;
          }
          if ((local_431 & 1) == 0) {
            for (s.field_2._8_8_ = 1; uVar1 = s.field_2._8_8_, uVar5 = std::__cxx11::string::size(),
                (ulong)uVar1 < uVar5; s.field_2._8_8_ = s.field_2._8_8_ + 1) {
              puVar7 = (undefined1 *)std::__cxx11::string::at((ulong)local_38);
              local_1b1 = *puVar7;
              local_1b0 = &local_1b1;
              local_1a8 = 1;
              std::allocator<char>::allocator();
              std::__cxx11::string::string((string *)local_1a0,local_1b0,local_1a8,&local_1b2);
              std::allocator<char>::~allocator(&local_1b2);
              local_1c0._M_node =
                   (_Base_ptr)
                   std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::find(&this->flags_,(key_type *)local_1a0);
              local_1c8._M_node =
                   (_Base_ptr)
                   std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::end(&this->flags_);
              bVar3 = std::operator!=(&local_1c0,&local_1c8);
              local_551 = 0;
              if (bVar3) {
                pmVar9 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::at(&this->flags_,(key_type *)local_1a0);
                pmVar10 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                          ::at(&this->data_,pmVar9);
                local_551 = pmVar10->mode_;
              }
              if ((local_551 & 1) == 0) {
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               ((long)&c_1.field_2 + 8),"invalid flag \'",local_38);
                std::operator+(&local_228,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               ((long)&c_1.field_2 + 8),"\'");
                std::__cxx11::string::operator=((string *)&this->error_,(string *)&local_228);
                std::__cxx11::string::~string((string *)&local_228);
                std::__cxx11::string::~string((string *)(c_1.field_2._M_local_buf + 8));
                this_local._4_4_ = -1;
                local_f4 = 1;
              }
              else {
                pmVar9 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::at(&this->flags_,(key_type *)local_1a0);
                pmVar10 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                          ::at(&this->data_,pmVar9);
                if ((pmVar10->seen_ & 1U) == 0) {
                  pmVar9 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ::at(&this->flags_,(key_type *)local_1a0);
                  pmVar10 = std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                            ::at(&this->data_,pmVar9);
                  std::__cxx11::string::operator=((string *)&pmVar10->value_,"1");
                  pmVar9 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ::at(&this->flags_,(key_type *)local_1a0);
                  pmVar10 = std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                            ::at(&this->data_,pmVar9);
                  pmVar10->seen_ = true;
                  local_f4 = 0;
                }
                else {
                  std::operator+(&local_208,"flag \'-",
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_1a0);
                  std::operator+(&local_1e8,&local_208,"\' has already been seen");
                  std::__cxx11::string::operator=((string *)&this->error_,(string *)&local_1e8);
                  std::__cxx11::string::~string((string *)&local_1e8);
                  std::__cxx11::string::~string((string *)&local_208);
                  this_local._4_4_ = -1;
                  local_f4 = 1;
                }
              }
              std::__cxx11::string::~string((string *)local_1a0);
              if (local_f4 != 0) goto LAB_0010fe42;
            }
LAB_0010fe38:
            local_f4 = 0;
          }
          else {
            pmVar9 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::at(&this->flags_,(key_type *)local_88);
            pmVar10 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                      ::at(&this->data_,pmVar9);
            if ((pmVar10->seen_ & 1U) == 0) {
              uVar5 = std::__cxx11::string::size();
              if ((uVar5 < 3) ||
                 (pcVar6 = (char *)std::__cxx11::string::at((ulong)local_38), pbVar2 = local_38,
                 *pcVar6 == '=')) {
                uVar5 = std::__cxx11::string::size();
                if ((uVar5 < 4) ||
                   (pcVar6 = (char *)std::__cxx11::string::at((ulong)local_38), pbVar2 = local_38,
                   *pcVar6 != '=')) {
                  if (_argv_local._4_4_ <= (int)tmp + 1) {
                    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&j,"flag \'-",
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_88);
                    std::operator+(&local_158,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&j,"\' requires an arg");
                    std::__cxx11::string::operator=((string *)&this->error_,(string *)&local_158);
                    std::__cxx11::string::~string((string *)&local_158);
                    std::__cxx11::string::~string((string *)&j);
                    this_local._4_4_ = -1;
                    local_f4 = 1;
                    goto LAB_0010fe42;
                  }
                  pvVar8 = std::
                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::at(_argv,(long)((int)tmp + 1));
                  pmVar9 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ::at(&this->flags_,(key_type *)local_88);
                  pmVar10 = std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                            ::at(&this->data_,pmVar9);
                  std::__cxx11::string::operator=((string *)&pmVar10->value_,(string *)pvVar8);
                  pmVar9 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ::at(&this->flags_,(key_type *)local_88);
                  pmVar10 = std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                            ::at(&this->data_,pmVar9);
                  pmVar10->seen_ = true;
                  tmp._0_4_ = (int)tmp + 1;
                }
                else {
                  std::__cxx11::string::size();
                  std::__cxx11::string::substr((ulong)local_138,(ulong)pbVar2);
                  pmVar9 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ::at(&this->flags_,(key_type *)local_88);
                  pmVar10 = std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                            ::at(&this->data_,pmVar9);
                  std::__cxx11::string::operator=((string *)&pmVar10->value_,local_138);
                  std::__cxx11::string::~string(local_138);
                  pmVar9 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ::at(&this->flags_,(key_type *)local_88);
                  pmVar10 = std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                            ::at(&this->data_,pmVar9);
                  pmVar10->seen_ = true;
                }
              }
              else {
                std::__cxx11::string::size();
                std::__cxx11::string::substr((ulong)local_118,(ulong)pbVar2);
                pmVar9 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::at(&this->flags_,(key_type *)local_88);
                pmVar10 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                          ::at(&this->data_,pmVar9);
                std::__cxx11::string::operator=((string *)&pmVar10->value_,local_118);
                std::__cxx11::string::~string(local_118);
                pmVar9 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::at(&this->flags_,(key_type *)local_88);
                pmVar10 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
                          ::at(&this->data_,pmVar9);
                pmVar10->seen_ = true;
              }
              goto LAB_0010fe38;
            }
            std::operator+(&local_f0,"flag \'-",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_88);
            std::operator+(&local_d0,&local_f0,"\' has already been seen");
            std::__cxx11::string::operator=((string *)&this->error_,(string *)&local_d0);
            std::__cxx11::string::~string((string *)&local_d0);
            std::__cxx11::string::~string((string *)&local_f0);
            this_local._4_4_ = -1;
            local_f4 = 1;
          }
LAB_0010fe42:
          std::__cxx11::string::~string((string *)local_88);
        }
        if (local_f4 != 0) {
          return this_local._4_4_;
        }
      }
      else {
        lVar4 = std::__cxx11::string::size();
        if (lVar4 == 0) {
          std::__cxx11::string::append((string *)&this->positional_);
        }
        else {
          std::operator+(&local_58," ",local_38);
          std::__cxx11::string::append((string *)&this->positional_);
          std::__cxx11::string::~string((string *)&local_58);
        }
      }
LAB_00110601:
    }
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int parse_args(int _argc, std::vector<std::string> _argv)
  {
    if (_argc < 1) return 1;

    bool dashdash {false};

    // loop through arg vector
    for (int i = 0; i < _argc; ++i)
    {
      std::string const& tmp {_argv.at(static_cast<size_t>(i))};
      // std::cout << "ARG: " << i << " -> " << tmp << std::endl;

      if (dashdash)
      {
        if (positional_.size() == 0)
        {
          positional_.append(tmp);
        }
        else
        {
          positional_.append(" " + tmp);
        }
        continue;
      }

      if (tmp.size() > 1 && tmp.at(0) == '-' && tmp.at(1) != '-')
      {
        // short
        // std::cout << "SHORT: " << tmp << std::endl;

        std::string c {tmp.at(1)};
        if (flags_.find(c) != flags_.end() && !(data_.at(flags_.at(c)).mode_))
        {
          // short arg
          // std::cout << "SHORT: arg -> " << c << std::endl;

          if (data_.at(flags_.at(c)).seen_)
          {
            // error
            error_ = "flag '-" + c + "' has already been seen";
            return -1;
          }

          if (tmp.size() > 2 && tmp.at(2) != '=')
          {
            data_.at(flags_.at(c)).value_ = tmp.substr(2, tmp.size() - 1);
            data_.at(flags_.at(c)).seen_ = true;
          }
          else if (tmp.size() > 3 && tmp.at(2) == '=')
          {
            data_.at(flags_.at(c)).value_ = tmp.substr(3, tmp.size() - 1);
            data_.at(flags_.at(c)).seen_ = true;
          }
          else if (i + 1 < _argc)
          {
            data_.at(flags_.at(c)).value_ = _argv.at(static_cast<size_t>(i + 1));
            data_.at(flags_.at(c)).seen_ = true;
            ++i;
          }
          else
          {
            // error
            error_ = "flag '-" + c + "' requires an arg";
            return -1;
          }
        }
        else
        {
          // short mode
          for (size_t j = 1; j < tmp.size(); ++j)
          {
            std::string s {tmp.at(j)};

            if (flags_.find(s) != flags_.end() && data_.at(flags_.at(s)).mode_)
            {
              // std::cout << "SHORT: mode -> " << c << std::endl;

              if (data_.at(flags_.at(s)).seen_)
              {
                // error
                error_ = "flag '-" + s + "' has already been seen";
                return -1;
              }

              data_.at(flags_.at(s)).value_ = "1";
              data_.at(flags_.at(s)).seen_ = true;
            }
            else
            {
              // error
              error_ = "invalid flag '" + tmp + "'";
              return -1;
            }
          }
        }
      }
      else if (tmp.size() > 2 && tmp.at(0) == '-' && tmp.at(1) == '-')
      {
        // long || --
        // std::cout << "LONG: " << tmp << std::endl;
        std::string c {tmp.substr(2, tmp.size() - 1)};
        std::string a;

        auto const delim = c.find("=");
        if (delim != std::string::npos)
        {
          c = tmp.substr(2, delim);
          a = tmp.substr(3 + delim, tmp.size() - 1);
        }

        if (data_.find(c) != data_.end())
        {
          if (data_.at(c).seen_)
          {
            // error
            error_ = "option '--" + c + "' has already been seen";
            return -1;
          }

          if (data_.at(c).mode_ && a.size() == 0)
          {
            // std::cout << "LONG: mode -> " << c << std::endl;
            data_.at(c).value_ = "1";
            data_.at(c).seen_ = true;
          }
          else
          {
            // std::cout << "LONG: arg -> " << c << std::endl;
            if (a.size() > 0)
            {
              data_.at(c).value_ = a;
              data_.at(c).seen_ = true;
            }
            else if (i + 1 < _argc)
            {
              data_.at(c).value_ = _argv.at(static_cast<size_t>(i + 1));
              data_.at(c).seen_ = true;
              ++i;
            }
            else
            {
              // error
              error_ = "option '--" + c + "' requires an arg";
              return -1;
            }
          }
        }
        else
        {
          // error
          error_ = "invalid option '" + tmp + "'";
          return -1;
        }
      }
      else if (tmp.size() > 0 && is_positional_)
      {
        // positional
        // std::cout << "POS: " << tmp << std::endl;
        if (tmp == "--")
        {
          dashdash = true;
        }
        else
        {
          if (positional_.size() == 0)
          {
            positional_.append(tmp);
          }
          else
          {
            positional_.append(" " + tmp);
          }
        }
      }
      else
      {
        // error
        error_ = "no match for '" + tmp + "'";
        return -1;
      }
    }

    return 0;
  }